

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O3

path * helper::resolve(path *__return_storage_ptr__,path *p,path *base)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  iterator it;
  path absolute;
  int local_e0;
  undefined4 uStack_dc;
  long local_d0 [2];
  path *local_c0;
  size_type local_b8;
  iterator local_b0;
  path local_80;
  long *local_60 [2];
  long local_50 [2];
  path *local_40;
  size_type sStack_38;
  
  (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_pathname).field_2;
  (__return_storage_ptr__->m_pathname)._M_string_length = 0;
  (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  boost::filesystem::detail::absolute(&local_80,p,(error_code *)base);
  boost::filesystem::path::begin();
  do {
    boost::filesystem::path::end();
    bVar1 = local_b8 == local_b0.m_pos;
    bVar2 = local_b0.m_path_ptr == local_c0;
    if ((long *)CONCAT44(uStack_dc,local_e0) != local_d0) {
      operator_delete((long *)CONCAT44(uStack_dc,local_e0),local_d0[0] + 1);
    }
    if (bVar1 && bVar2) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0.m_element.m_pathname._M_dataplus._M_p !=
          &local_b0.m_element.m_pathname.field_2) {
        operator_delete(local_b0.m_element.m_pathname._M_dataplus._M_p,
                        local_b0.m_element.m_pathname.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.m_pathname._M_dataplus._M_p != &local_80.m_pathname.field_2) {
        operator_delete(local_80.m_pathname._M_dataplus._M_p,
                        local_80.m_pathname.field_2._M_allocated_capacity + 1);
      }
      return __return_storage_ptr__;
    }
    iVar3 = boost::filesystem::path::compare(&local_b0.m_element,"..");
    if (iVar3 == 0) {
      boost::filesystem::detail::symlink_status
                ((path *)&local_e0,(error_code *)__return_storage_ptr__);
      if (local_e0 != 4) {
        boost::filesystem::path::filename();
        iVar3 = boost::filesystem::path::compare((path *)&local_e0,"..");
        if ((long *)CONCAT44(uStack_dc,local_e0) != local_d0) {
          operator_delete((long *)CONCAT44(uStack_dc,local_e0),local_d0[0] + 1);
        }
        if (iVar3 != 0) {
          boost::filesystem::path::parent_path();
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_e0);
          if ((long *)CONCAT44(uStack_dc,local_e0) != local_d0) {
            operator_delete((long *)CONCAT44(uStack_dc,local_e0),local_d0[0] + 1);
          }
          goto LAB_0015f27e;
        }
      }
LAB_0015f273:
      boost::filesystem::path::operator/=(__return_storage_ptr__,&local_b0.m_element);
    }
    else {
      iVar3 = boost::filesystem::path::compare(&local_b0.m_element,".");
      if (iVar3 != 0) goto LAB_0015f273;
    }
LAB_0015f27e:
    local_60[0] = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_60,local_b0.m_element.m_pathname._M_dataplus._M_p,
               local_b0.m_element.m_pathname._M_dataplus._M_p +
               local_b0.m_element.m_pathname._M_string_length);
    local_40 = local_b0.m_path_ptr;
    sStack_38 = local_b0.m_pos;
    boost::filesystem::path::m_path_iterator_increment(&local_b0);
    if (local_60[0] != local_50) {
      operator_delete(local_60[0],local_50[0] + 1);
    }
  } while( true );
}

Assistant:

fs::path resolve( const fs::path &p, const fs::path &base )
	{
		fs::path ret;
		fs::path absolute = fs::absolute( p, base );

		for( fs::path::iterator it = absolute.begin() ; it != absolute.end() ; it++ )
		{
			if( *it == ".." )
			{//Go one dir backwars
				if( fs::is_symlink( ret ) )
				{//Check for symlinks
					ret /= *it;
				}
				else if( ret.filename() == ".." )
				{//Multiple ..s'
					ret /= *it;
				}
				// Otherwise it should be safe to resolve the parent
				else
					ret = ret.parent_path();
			}
			else if( *it == "." );//Ignore
			else
			{//Normal dirs
				ret /= *it;
			}
		}
		return ret;
	}